

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

void display_player(wchar_t mode)

{
  ushort uVar1;
  wchar_t wVar2;
  ui_entry *puVar3;
  byte bVar4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t c;
  panel *p;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  void *pvVar9;
  cached_object_data **ppcVar10;
  object *poVar11;
  player *ppVar12;
  long lVar13;
  wchar_t a;
  ulong uVar14;
  wchar_t *pwVar15;
  wchar_t wVar16;
  cached_object_data **ppcVar17;
  uint uVar18;
  char_sheet_config *pcVar19;
  wchar_t slot;
  wchar_t *pwVar20;
  long lVar21;
  cached_player_data *pcache;
  cached_player_data *local_78;
  char_sheet_config *local_70;
  void *local_68;
  ui_entry_details local_5c;
  long local_38;
  
  if ((cached_config == (char_sheet_config *)0x0) ||
     (cached_config->res_cols != cached_config->res_nlabel + (uint)(player->body).count + L'\x01'))
  {
    configure_char_sheet();
  }
  clear_from(L'\0');
  if ((Term == angband_term[0]) || (player->upkeep->playing == true)) {
    display_player_stat_info();
    if (mode == L'\0') {
      display_player_xtra_info();
      return;
    }
    p = get_panel_topleft();
    display_panel(p,true,&panels[0].bounds);
    panel_free(p);
    pcVar19 = cached_config;
    pwVar7 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
    pwVar8 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
    pvVar9 = mem_alloc((ulong)(player->body).count << 3);
    ppcVar10 = (cached_object_data **)mem_zalloc((ulong)(player->body).count << 3);
    local_78 = (cached_player_data *)0x0;
    if ((player->body).count != 0) {
      uVar14 = 0;
      do {
        poVar11 = slot_object(player,(wchar_t)uVar14);
        *(object **)((long)pvVar9 + uVar14 * 8) = poVar11;
        uVar14 = uVar14 + 1;
      } while (uVar14 < (player->body).count);
    }
    c_put_str('\x01',"abcdefgimnop@",L'\x01',L'\x1a');
    local_5c.label_position.x = (uint)(player->body).count + L'\x1f';
    local_5c.value_position.x = L'\x1a';
    local_5c.position_step = (loc)loc(1,0);
    local_5c.combined_position = (loc)loc(0,0);
    local_5c.vertical_label = false;
    local_5c.alternate_color_first = false;
    local_5c.known_rune = true;
    local_5c.show_combined = false;
    if (L'\0' < pcVar19->n_stat_mod_entries) {
      lVar21 = 0;
      do {
        puVar3 = pcVar19->stat_mod_entries[lVar21];
        if ((player->body).count == 0) {
          uVar18 = 0;
        }
        else {
          uVar14 = 0;
          pwVar15 = pwVar7;
          ppcVar17 = ppcVar10;
          pwVar20 = pwVar8;
          do {
            compute_ui_entry_values_for_object
                      (puVar3,*(object **)((long)pvVar9 + uVar14 * 8),player,ppcVar17,pwVar15,
                       pwVar20);
            uVar14 = uVar14 + 1;
            uVar1 = (player->body).count;
            uVar18 = (uint)uVar1;
            pwVar20 = pwVar20 + 1;
            pwVar15 = pwVar15 + 1;
            ppcVar17 = ppcVar17 + 1;
          } while (uVar14 < uVar1);
        }
        compute_ui_entry_values_for_player
                  (puVar3,player,&local_78,(int *)((long)pwVar7 + (ulong)(uVar18 << 2)),
                   (int *)((ulong)(uVar18 << 2) + (long)pwVar8));
        pwVar7[(player->body).count] = L'\0';
        local_5c.label_position.y = (int)lVar21 + L'\x02';
        local_5c.value_position.y = local_5c.label_position.y;
        wVar6 = get_ui_entry_renderer_index(puVar3);
        ui_entry_renderer_apply
                  (wVar6,(wchar_t *)0x0,L'\0',pwVar7,pwVar8,(uint)(player->body).count + L'\x01',
                   &local_5c);
        lVar21 = lVar21 + 1;
      } while (lVar21 < pcVar19->n_stat_mod_entries);
      if (local_78 != (cached_player_data *)0x0) {
        release_cached_player_data(local_78);
      }
    }
    if ((player->body).count != 0) {
      uVar14 = 0;
      ppVar12 = player;
      do {
        if (ppcVar10[uVar14] != (cached_object_data *)0x0) {
          release_cached_object_data(ppcVar10[uVar14]);
          ppVar12 = player;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ppVar12->body).count);
    }
    mem_free(ppcVar10);
    mem_free(pvVar9);
    mem_free(pwVar8);
    mem_free(pwVar7);
    lVar21 = 0;
    do {
      pcVar19 = cached_config;
      pwVar7 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
      pwVar8 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
      local_68 = mem_alloc((ulong)(player->body).count << 3);
      ppcVar10 = (cached_object_data **)mem_zalloc((ulong)(player->body).count << 3);
      pvVar9 = local_68;
      local_78 = (cached_player_data *)0x0;
      wVar6 = pcVar19->res_regions[lVar21].col;
      local_70 = pcVar19;
      wVar16 = pcVar19->res_regions[lVar21].row;
      local_38 = lVar21;
      if ((player->body).count != 0) {
        uVar14 = 0;
        do {
          poVar11 = slot_object(player,(wchar_t)uVar14);
          *(object **)((long)pvVar9 + uVar14 * 8) = poVar11;
          uVar14 = uVar14 + 1;
          uVar1 = (player->body).count;
        } while (uVar14 < uVar1);
        if (uVar1 != 0) {
          wVar2 = local_70->res_nlabel;
          slot = L'\0';
          do {
            poVar11 = slot_object(player,slot);
            c = L' ';
            a = L'\x01';
            if (((poVar11 != (object *)0x0) && (tile_width == '\x01')) && (tile_height == '\x01')) {
              bVar4 = object_attr(poVar11);
              c = object_char(poVar11);
              a = (wchar_t)bVar4;
            }
            Term_putch(wVar2 + wVar6 + slot,wVar16,a,c);
            slot = slot + L'\x01';
          } while ((uint)slot < (uint)(player->body).count);
        }
      }
      pcVar19 = local_70;
      Term_putstr(wVar6,wVar16 + L'\x01',local_70->res_cols,L'\x01',"      abcdefgimnop@");
      local_5c.value_position.x = wVar6 + pcVar19->res_nlabel;
      local_5c.label_position.x = wVar6;
      local_5c.position_step = (loc)loc(1,0);
      local_5c.combined_position = (loc)loc(0,0);
      local_5c._32_4_ = ((uint)local_5c._32_4_ >> 0x10 & 0xff) << 0x10;
      lVar21 = local_38;
      if (L'\0' < pcVar19->n_resist_by_region[local_38]) {
        wVar16 = wVar16 + L'\x02';
        lVar13 = 0;
        pcVar19 = local_70;
        do {
          pvVar9 = local_68;
          puVar3 = pcVar19->resists_by_region[lVar21][lVar13].entry;
          if ((player->body).count == 0) {
            uVar18 = 0;
          }
          else {
            uVar14 = 0;
            ppcVar17 = ppcVar10;
            pwVar15 = pwVar8;
            pwVar20 = pwVar7;
            do {
              compute_ui_entry_values_for_object
                        (puVar3,*(object **)((long)pvVar9 + uVar14 * 8),player,ppcVar17,pwVar20,
                         pwVar15);
              uVar14 = uVar14 + 1;
              uVar1 = (player->body).count;
              uVar18 = (uint)uVar1;
              pwVar15 = pwVar15 + 1;
              pwVar20 = pwVar20 + 1;
              ppcVar17 = ppcVar17 + 1;
            } while (uVar14 < uVar1);
          }
          compute_ui_entry_values_for_player
                    (puVar3,player,&local_78,(int *)((long)pwVar7 + (ulong)(uVar18 << 2)),
                     (int *)((ulong)(uVar18 << 2) + (long)pwVar8));
          local_5c.label_position.y = wVar16;
          local_5c.value_position.y = wVar16;
          _Var5 = is_ui_entry_for_known_rune(puVar3,player);
          local_5c.known_rune = _Var5;
          wVar6 = get_ui_entry_renderer_index(puVar3);
          lVar21 = local_38;
          pcVar19 = local_70;
          ui_entry_renderer_apply
                    (wVar6,local_70->resists_by_region[local_38][lVar13].label,local_70->res_nlabel,
                     pwVar7,pwVar8,(uint)(player->body).count + L'\x01',&local_5c);
          lVar13 = lVar13 + 1;
          wVar16 = wVar16 + L'\x01';
        } while (lVar13 < pcVar19->n_resist_by_region[lVar21]);
        if (local_78 != (cached_player_data *)0x0) {
          release_cached_player_data(local_78);
        }
      }
      if ((player->body).count != 0) {
        uVar14 = 0;
        ppVar12 = player;
        do {
          if (ppcVar10[uVar14] != (cached_object_data *)0x0) {
            release_cached_object_data(ppcVar10[uVar14]);
            ppVar12 = player;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ppVar12->body).count);
      }
      mem_free(ppcVar10);
      mem_free(local_68);
      mem_free(pwVar8);
      mem_free(pwVar7);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
  }
  return;
}

Assistant:

void display_player(int mode)
{
	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	/* Erase screen */
	clear_from(0);

	/* When not playing, do not display in subwindows */
	if (Term != angband_term[0] && !player->upkeep->playing) return;

	/* Stat info */
	display_player_stat_info();

	if (mode) {
		struct panel *p = panels[0].panel();
		display_panel(p, panels[0].align_left, &panels[0].bounds);
		panel_free(p);

		/* Stat/Sustain flags */
		display_player_sust_info(cached_config);

		/* Other flags */
		display_player_flag_info();
	} else {
		/* Extra info */
		display_player_xtra_info();
	}
}